

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

ostream * operator<<(ostream *os,
                    vector<Result<float,_double>,_std::allocator<Result<float,_double>_>_> *rs)

{
  pointer pRVar1;
  ostream *poVar2;
  Result<float,_double> *r;
  pointer pRVar3;
  
  pRVar3 = (rs->super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(os,"Testing: ");
  poVar2 = std::operator<<(poVar2,(string *)pRVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(os,"Input range: ");
  poVar2 = std::operator<<(os,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pRVar3->inputRange).first);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pRVar3->inputRange).second);
  std::operator<<(poVar2,"), ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar2 = std::operator<<(poVar2," samples in range");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"Approximate loop and call overhead (already subtracted): ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(float)pRVar3->overheadNs / (float)pRVar3->samplesInRange);
  poVar2 = std::operator<<(poVar2," ns / call");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"Tested functions:");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  pRVar1 = (rs->super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (rs->
                super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
                _M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    poVar2 = operator<<(os,pRVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<Result<InputT, StorageT>>& rs)
{
    const auto& fr = rs.front();
    os << "Testing: " << fr.suiteName << std::endl;
    os << "Input range: ";
    os << "(" << fr.inputRange.first << ", " << fr.inputRange.second << "), ";
    os << fr.samplesInRange << " samples in range" << std::endl;
    os << "Approximate loop and call overhead (already subtracted): " << float(fr.overheadNs) / float(fr.samplesInRange) << " ns / call" << std::endl;
    os << "Tested functions:" << std::endl
       << std::endl;
    for (const auto& r : rs)
    {
        os << r << std::endl;
    }
    return os;
}